

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp.c
# Opt level: O3

void uhttp_client_dowork(HTTP_CLIENT_HANDLE handle)

{
  _Bool _Var1;
  STRING_HANDLE s2;
  XIO_HANDLE xio;
  int iVar2;
  int iVar3;
  uint uVar4;
  LIST_ITEM_HANDLE item_handle;
  int *__ptr;
  size_t size;
  char *pcVar5;
  size_t sVar6;
  STRING_HANDLE s1;
  LOGGER_LOG p_Var7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  uchar *buffer;
  long lVar11;
  uint uVar12;
  char *pcVar13;
  LOGGER_LOG l;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  int local_68;
  
  if ((handle != (HTTP_CLIENT_HANDLE)0x0) &&
     (xio_dowork(handle->xio_handle), handle->connected == 1)) {
    item_handle = singlylinkedlist_get_head_item(handle->data_list);
    while (item_handle != (LIST_ITEM_HANDLE)0x0) {
      __ptr = (int *)singlylinkedlist_item_get_value(item_handle);
      if (__ptr != (int *)0x0) {
        size = BUFFER_length(*(BUFFER_HANDLE *)(__ptr + 6));
        iVar2 = *__ptr;
        pcVar5 = STRING_c_str(*(STRING_HANDLE *)(__ptr + 2));
        if (iVar2 - 1U < 6) {
          s2 = *(STRING_HANDLE *)(__ptr + 4);
          pcVar13 = (&PTR_anon_var_dwarf_10dd_0011fcf8)[iVar2 - 1U];
          sVar6 = strlen(pcVar13);
          uVar16 = sVar6 + 0x10;
          if (0xffffffffffffffef < sVar6) {
            uVar16 = 0xffffffffffffffff;
          }
          sVar6 = strlen(pcVar5);
          lVar11 = sVar6 + uVar16;
          if (CARRY8(sVar6,uVar16)) {
            lVar11 = -1;
          }
          sVar6 = lVar11 + 1;
          if (sVar6 == 0) {
            sVar6 = 0xffffffffffffffff;
          }
          if ((sVar6 == 0xffffffffffffffff) ||
             (pcVar5 = (char *)malloc(sVar6), pcVar5 == (char *)0x0)) {
            p_Var7 = xlogging_get_log_function();
            if (p_Var7 != (LOGGER_LOG)0x0) {
              iVar2 = 0x3f9;
              pcVar5 = "Failure allocating Request data, size:%zu";
              goto LAB_00105b96;
            }
            goto LAB_00105c0e;
          }
          iVar2 = snprintf(pcVar5,sVar6,"%s %s HTTP/1.1\r\n",pcVar13);
          if (iVar2 < 1) {
            p_Var7 = xlogging_get_log_function();
            if (p_Var7 != (LOGGER_LOG)0x0) {
              iVar2 = 0x400;
              pcVar13 = "Failure writing request buffer";
LAB_00105bfc:
              (*p_Var7)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                        ,"construct_http_data",iVar2,1,pcVar13);
            }
LAB_00105c01:
            free(pcVar5);
            goto LAB_00105c0e;
          }
          s1 = STRING_construct(pcVar5);
          if (s1 == (STRING_HANDLE)0x0) {
            p_Var7 = xlogging_get_log_function();
            if (p_Var7 != (LOGGER_LOG)0x0) {
              iVar2 = 0x407;
              pcVar13 = "Failure creating buffer object";
              goto LAB_00105bfc;
            }
            goto LAB_00105c01;
          }
          iVar2 = STRING_concat_with_STRING(s1,s2);
          if (iVar2 != 0) {
            STRING_delete(s1);
            p_Var7 = xlogging_get_log_function();
            if (p_Var7 != (LOGGER_LOG)0x0) {
              iVar2 = 0x40d;
              pcVar13 = "Failure writing request buffers";
              goto LAB_00105bfc;
            }
            goto LAB_00105c01;
          }
          free(pcVar5);
          pcVar5 = STRING_c_str(s1);
          xio = handle->xio_handle;
          sVar6 = strlen(pcVar5);
          iVar2 = xio_send(xio,pcVar5,sVar6,send_complete_callback,(void *)0x0);
          if (iVar2 != 0) {
            p_Var7 = xlogging_get_log_function();
            if (p_Var7 != (LOGGER_LOG)0x0) {
              (*p_Var7)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                        ,"write_text_line",0x180,1,"Failure calling xio_send.");
            }
            p_Var7 = xlogging_get_log_function();
            if (p_Var7 != (LOGGER_LOG)0x0) {
              (*p_Var7)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                        ,"send_http_data",0x426,1,"Failure writing request buffer");
            }
            STRING_delete(s1);
            goto LAB_00105c3e;
          }
          if (handle->trace_on == true) {
            pcVar13 = strstr(pcVar5,"\r\nAuthorization:");
            pcVar8 = strstr(pcVar5,"\r\nProxy-Authorization:");
            iVar15 = (int)pcVar5;
            iVar2 = (int)pcVar8;
            if (pcVar13 == (char *)0x0) {
              if (pcVar8 == (char *)0x0) {
                p_Var7 = xlogging_get_log_function();
                if (p_Var7 != (LOGGER_LOG)0x0) {
                  (*p_Var7)(AZ_LOG_TRACE,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                            ,"log_text_line",0x153,1,"%s",pcVar5);
                }
              }
              else {
                pcVar13 = strstr(pcVar8 + 1,"\r\n");
                if ((pcVar13 != (char *)0x0) &&
                   (p_Var7 = xlogging_get_log_function(), p_Var7 != (LOGGER_LOG)0x0)) {
                  sVar6 = strlen(pcVar5);
                  (*p_Var7)(AZ_LOG_TRACE,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                            ,"log_text_line",0x164,1,"%.*s \r\nProxy-Authorization: *** %.*s",
                            (ulong)(uint)(iVar2 - iVar15),pcVar5,
                            (ulong)(uint)((int)sVar6 + (iVar15 - (int)pcVar13)),pcVar13);
                }
              }
            }
            else {
              pcVar9 = strstr(pcVar13 + 1,"\r\n");
              iVar3 = (int)pcVar13;
              local_68 = (int)pcVar9;
              if (pcVar8 == (char *)0x0) {
                if ((pcVar9 != (char *)0x0) &&
                   (p_Var7 = xlogging_get_log_function(), p_Var7 != (LOGGER_LOG)0x0)) {
                  sVar6 = strlen(pcVar5);
                  (*p_Var7)(AZ_LOG_TRACE,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                            ,"log_text_line",0x15b,1,"%.*s \r\nAuthorization: *** %.*s",
                            (ulong)(uint)(iVar3 - iVar15),pcVar5,
                            (ulong)(uint)((int)sVar6 + (iVar15 - local_68)),pcVar9);
                }
              }
              else {
                pcVar10 = strstr(pcVar8 + 1,"\r\n");
                p_Var7 = xlogging_get_log_function();
                if (pcVar13 < pcVar8) {
                  if (p_Var7 != (LOGGER_LOG)0x0) {
                    uVar4 = iVar3 - iVar15;
                    uVar12 = iVar2 - local_68;
                    uVar14 = (int)pcVar10 - iVar15;
                    iVar2 = 0x16e;
                    pcVar8 = "%.*s \r\nAuthorization: *** %.*s \r\nProxy-Authorization: *** %.*s";
                    pcVar13 = pcVar9;
                    pcVar9 = pcVar10;
LAB_00105fb2:
                    (*p_Var7)(AZ_LOG_TRACE,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                              ,"log_text_line",iVar2,1,pcVar8,(ulong)uVar4,pcVar5,(ulong)uVar12,
                              pcVar13,(ulong)uVar14,pcVar9);
                  }
                }
                else if (p_Var7 != (LOGGER_LOG)0x0) {
                  uVar4 = iVar2 - iVar15;
                  uVar12 = iVar3 - (int)pcVar10;
                  uVar14 = local_68 - iVar15;
                  iVar2 = 0x175;
                  pcVar8 = "%.*s \r\nProxy-Authorization: *** %.*s \r\nAuthorization: *** %.*s";
                  pcVar13 = pcVar10;
                  goto LAB_00105fb2;
                }
              }
            }
          }
          STRING_delete(s1);
          if (size != 0) {
            buffer = BUFFER_u_char(*(BUFFER_HANDLE *)(__ptr + 6));
            iVar2 = xio_send(handle->xio_handle,buffer,size,send_complete_callback,(void *)0x0);
            if (iVar2 == 0) {
              if (handle->trace_on == true) {
                _Var1 = handle->trace_body;
                p_Var7 = xlogging_get_log_function();
                if (_Var1 == true) {
                  if (p_Var7 != (LOGGER_LOG)0x0) {
                    (*p_Var7)(AZ_LOG_TRACE,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                              ,"write_data_line",0x19f,1,"len: %d\r\n%.*s\r\n",size,size,buffer);
                  }
                }
                else if (p_Var7 != (LOGGER_LOG)0x0) {
                  (*p_Var7)(AZ_LOG_TRACE,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                            ,"write_data_line",0x1a3,1,"<data> len: %d\r\n",size);
                }
              }
              goto LAB_00105c84;
            }
            p_Var7 = xlogging_get_log_function();
            if (p_Var7 != (LOGGER_LOG)0x0) {
              (*p_Var7)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                        ,"write_data_line",0x193,1,"Failure calling xio_send.");
            }
            p_Var7 = xlogging_get_log_function();
            if (p_Var7 != (LOGGER_LOG)0x0) {
              iVar2 = 0x5b1;
              goto LAB_00105c5c;
            }
            goto LAB_00105c6e;
          }
        }
        else {
          p_Var7 = xlogging_get_log_function();
          if (p_Var7 != (LOGGER_LOG)0x0) {
            iVar2 = 0x3eb;
            pcVar5 = "Invalid request method %s specified";
            sVar6 = 0;
LAB_00105b96:
            (*p_Var7)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                      ,"construct_http_data",iVar2,1,pcVar5,sVar6);
          }
LAB_00105c0e:
          p_Var7 = xlogging_get_log_function();
          if (p_Var7 != (LOGGER_LOG)0x0) {
            (*p_Var7)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                      ,"send_http_data",0x41d,1,"Failure constructing http data");
          }
LAB_00105c3e:
          p_Var7 = xlogging_get_log_function();
          if (p_Var7 != (LOGGER_LOG)0x0) {
            iVar2 = 0x5a6;
LAB_00105c5c:
            (*p_Var7)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                      ,"uhttp_client_dowork",iVar2,1,"Failure writing content buffer");
          }
LAB_00105c6e:
          if (handle->on_error != (ON_HTTP_ERROR_CALLBACK)0x0) {
            (*handle->on_error)(handle->error_user_ctx,HTTP_CALLBACK_REASON_SEND_FAILED);
          }
        }
LAB_00105c84:
        STRING_delete(*(STRING_HANDLE *)(__ptr + 2));
        BUFFER_delete(*(BUFFER_HANDLE *)(__ptr + 6));
        STRING_delete(*(STRING_HANDLE *)(__ptr + 4));
        free(__ptr);
      }
      singlylinkedlist_remove(handle->data_list,item_handle);
      item_handle = singlylinkedlist_get_head_item(handle->data_list);
    }
  }
  return;
}

Assistant:

void uhttp_client_dowork(HTTP_CLIENT_HANDLE handle)
{
    if (handle != NULL)
    {
        /* Codes_SRS_UHTTP_07_037: [http_client_dowork shall call the underlying xio_dowork function. ] */
        HTTP_CLIENT_HANDLE_DATA* http_data = (HTTP_CLIENT_HANDLE_DATA*)handle;
        xio_dowork(http_data->xio_handle);

        // Wait till I'm connected
        if (handle->connected == 1)
        {
            LIST_ITEM_HANDLE pending_list_item;
            /* Codes_SRS_UHTTP_07_016: [http_client_dowork shall iterate through the queued Data using the xio interface to send the http request in the following ways...] */
            while ((pending_list_item = singlylinkedlist_get_head_item(http_data->data_list)) != NULL)
            {
                HTTP_SEND_DATA* send_data = (HTTP_SEND_DATA*)singlylinkedlist_item_get_value(pending_list_item);
                if (send_data != NULL)
                {
                    size_t content_len = BUFFER_length(send_data->content);
                    /* Codes_SRS_UHTTP_07_052: [uhttp_client_dowork shall call xio_send to transmits the header information... ] */
                    if (send_http_data(http_data, send_data->request_type, STRING_c_str(send_data->relative_path), send_data->header_line) != 0)
                    {
                        LogError("Failure writing content buffer");
                        if (http_data->on_error)
                        {
                            http_data->on_error(http_data->error_user_ctx, HTTP_CALLBACK_REASON_SEND_FAILED);
                        }
                    }
                    else if (content_len > 0)
                    {
                        /* Codes_SRS_UHTTP_07_053: [ Then uhttp_client_dowork shall use xio_send to transmit the content of the http request. ] */
                        if (write_data_line(http_data, BUFFER_u_char(send_data->content), content_len) != 0)
                        {
                            LogError("Failure writing content buffer");
                            if (http_data->on_error)
                            {
                                http_data->on_error(http_data->error_user_ctx, HTTP_CALLBACK_REASON_SEND_FAILED);
                            }
                        }
                    }

                    /* Codes_SRS_UHTTP_07_046: [ http_client_dowork shall free resouces queued to send to the http endpoint. ] */
                    STRING_delete(send_data->relative_path);
                    BUFFER_delete(send_data->content);
                    STRING_delete(send_data->header_line);
                    free(send_data);
                }
                (void)singlylinkedlist_remove(http_data->data_list, pending_list_item);
            }
        }
    }
}